

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recycling_allocator.hpp
# Opt level: O0

void __thiscall
asio::detail::
recycling_allocator<asio::detail::executor_function::impl<asio::detail::binder0<asio::detail::binder1<std::function<void_(const_std::error_code_&)>,_std::error_code>_>,_std::allocator<void>_>,_asio::detail::thread_info_base::executor_function_tag>
::deallocate(recycling_allocator<asio::detail::executor_function::impl<asio::detail::binder0<asio::detail::binder1<std::function<void_(const_std::error_code_&)>,_std::error_code>_>,_std::allocator<void>_>,_asio::detail::thread_info_base::executor_function_tag>
             *this,impl<asio::detail::binder0<asio::detail::binder1<std::function<void_(const_std::error_code_&)>,_std::error_code>_>,_std::allocator<void>_>
                   *p,size_t n)

{
  thread_info_base *ptVar1;
  long in_RDX;
  undefined8 in_RSI;
  
  ptVar1 = thread_context::top_of_thread_call_stack();
  thread_info_base::deallocate<asio::detail::thread_info_base::executor_function_tag>
            (ptVar1,in_RSI,in_RDX << 6);
  return;
}

Assistant:

void deallocate(T* p, std::size_t n)
  {
#if !defined(ASIO_DISABLE_SMALL_BLOCK_RECYCLING)
    thread_info_base::deallocate(Purpose(),
        thread_context::top_of_thread_call_stack(), p, sizeof(T) * n);
#else // !defined(ASIO_DISABLE_SMALL_BLOCK_RECYCLING)
    (void)n;
    asio::aligned_delete(p);
#endif // !defined(ASIO_DISABLE_SMALL_BLOCK_RECYCLING)
  }